

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::ReadAndInterpretStatusByte(DeathTestImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  ostream *poVar6;
  size_t sVar7;
  undefined8 extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  undefined8 uVar9;
  uint uVar10;
  char flag;
  Message error;
  char buffer [256];
  byte local_221;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  int local_19c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138 [8];
  
LAB_00138f1f:
  sVar3 = read(this->read_fd_,&local_221,1);
  iVar2 = (int)sVar3;
  if (iVar2 == -1) goto code_r0x00138f38;
  if (iVar2 == 0) {
    this->outcome_ = DIED;
    goto LAB_00139030;
  }
  if (iVar2 == 1) {
    if (local_221 < 0x52) {
      if (local_221 == 0x49) {
        iVar2 = this->read_fd_;
        Message::Message((Message *)&local_198);
        do {
          while( true ) {
            sVar3 = read(iVar2,local_138,0xff);
            uVar10 = (uint)sVar3;
            if ((int)uVar10 < 1) break;
            *(undefined1 *)((long)&local_138[0]._M_dataplus._M_p + (ulong)(uVar10 & 0x7fffffff)) = 0
            ;
            sVar7 = strlen((char *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_198._M_dataplus._M_p + 0x10),(char *)local_138,sVar7);
          }
        } while ((uVar10 == 0xffffffff) && (piVar4 = __errno_location(), *piVar4 == 4));
        if (uVar10 == 0) {
          GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                             ,0x168);
          StringStreamToString(&local_220,(stringstream *)local_198._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,local_220._M_dataplus._M_p,local_220._M_string_length);
        }
        else {
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                             ,0x16b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error while reading death test internal: ",0x29);
          GetLastErrnoDescription_abi_cxx11_();
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_220._M_dataplus._M_p,
                              local_220._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        GTestLog::~GTestLog((GTestLog *)&local_200);
        if ((stringstream *)local_198._M_dataplus._M_p != (stringstream *)0x0) {
          (**(code **)(*(long *)local_198._M_dataplus._M_p + 8))(local_198._M_dataplus._M_p);
        }
      }
      else {
        if (local_221 != 0x4c) goto LAB_001390e4;
        this->outcome_ = LIVED;
      }
    }
    else if (local_221 == 0x54) {
      this->outcome_ = THREW;
    }
    else if (local_221 == 0x52) {
      this->outcome_ = RETURNED;
    }
    else {
LAB_001390e4:
      GTestLog::GTestLog((GTestLog *)local_138,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                         ,0x1eb);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Death test child process reported ",0x22);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unexpected status byte (",0x18);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      GTestLog::~GTestLog((GTestLog *)local_138);
    }
    goto LAB_00139030;
  }
  goto LAB_00138fa9;
code_r0x00138f38:
  piVar4 = __errno_location();
  if (*piVar4 != 4) goto LAB_00138fa9;
  goto LAB_00138f1f;
LAB_00138fa9:
  GTestLog::GTestLog((GTestLog *)&local_220,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                     ,0x1f0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Read from death test child process failed: ",0x2b);
  GetLastErrnoDescription_abi_cxx11_();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,local_138[0]._M_dataplus._M_p,local_138[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,local_138[0].field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_220);
LAB_00139030:
  do {
    iVar2 = close(this->read_fd_);
    if (iVar2 != -1) {
      this->read_fd_ = -1;
      return;
    }
    piVar4 = __errno_location();
  } while (*piVar4 == 4);
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"CHECK failed: File ","");
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_158,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/langelog[P]CppEnv_vscode/thirdparty/googletest/googletest/src/gtest-death-test.cc"
                     );
  local_178._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p == paVar8) {
    local_178.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_178.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  }
  else {
    local_178.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_178._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_178,", line ");
  local_1e0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p == paVar8) {
    local_1e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_1e0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  }
  else {
    local_1e0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_1e0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  local_19c = 499;
  StreamableToString<int>(&local_1c0,&local_19c);
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    uVar9 = local_1e0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar9 < local_1c0._M_string_length + local_1e0._M_string_length) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      uVar9 = local_1c0.field_2._M_allocated_capacity;
    }
    if (local_1c0._M_string_length + local_1e0._M_string_length <= (ulong)uVar9) {
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_1c0,0,0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      goto LAB_001393fb;
    }
  }
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_1e0,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
LAB_001393fb:
  local_200._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p == paVar8) {
    local_200.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_200.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  }
  else {
    local_200.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_200._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  paVar8->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_200,": ");
  local_198._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p == paVar8) {
    local_198.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_198.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  }
  else {
    local_198.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_198._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_198,"posix::Close(read_fd())");
  local_220._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p == paVar8) {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_220.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  }
  else {
    local_220.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_220._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_220," != -1");
  local_138[0]._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p == paVar8) {
    local_138[0].field_2._0_8_ = paVar8->_M_allocated_capacity;
    local_138[0].field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  }
  else {
    local_138[0].field_2._0_8_ = paVar8->_M_allocated_capacity;
  }
  local_138[0]._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  DeathTestAbort(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  GTestLog::~GTestLog((GTestLog *)&local_200);
  if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
    (**(code **)(local_158.field_2._M_allocated_capacity + 8))(paVar1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void DeathTestImpl::ReadAndInterpretStatusByte() {
  char flag;
  int bytes_read;

  // The read() here blocks until data is available (signifying the
  // failure of the death test) or until the pipe is closed (signifying
  // its success), so it's okay to call this in the parent before
  // the child process has exited.
  do {
    bytes_read = posix::Read(read_fd(), &flag, 1);
  } while (bytes_read == -1 && errno == EINTR);

  if (bytes_read == 0) {
    set_outcome(DIED);
  } else if (bytes_read == 1) {
    switch (flag) {
      case kDeathTestReturned:
        set_outcome(RETURNED);
        break;
      case kDeathTestThrew:
        set_outcome(THREW);
        break;
      case kDeathTestLived:
        set_outcome(LIVED);
        break;
      case kDeathTestInternalError:
        FailFromInternalError(read_fd());  // Does not return.
        break;
      default:
        GTEST_LOG_(FATAL) << "Death test child process reported "
                          << "unexpected status byte ("
                          << static_cast<unsigned int>(flag) << ")";
    }
  } else {
    GTEST_LOG_(FATAL) << "Read from death test child process failed: "
                      << GetLastErrnoDescription();
  }
  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Close(read_fd()));
  set_read_fd(-1);
}